

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_Flate.cc
# Opt level: O0

bool Pl_Flate::zopfli_enabled(void)

{
  bool bVar1;
  int iVar2;
  bool local_72;
  allocator<char> local_51;
  string local_50;
  undefined1 local_30 [8];
  string value;
  
  bVar1 = zopfli_supported();
  if (bVar1) {
    std::__cxx11::string::string((string *)local_30);
    if ((zopfli_enabled()::enabled == '\0') &&
       (iVar2 = __cxa_guard_acquire(&zopfli_enabled()::enabled), iVar2 != 0)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"QPDF_ZOPFLI",&local_51);
      bVar1 = QUtil::get_env(&local_50,(string *)local_30);
      local_72 = false;
      if (bVar1) {
        local_72 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_30,"disabled");
      }
      std::__cxx11::string::~string((string *)&local_50);
      std::allocator<char>::~allocator(&local_51);
      zopfli_enabled::enabled = local_72;
      __cxa_guard_release(&zopfli_enabled()::enabled);
    }
    value.field_2._M_local_buf[0xf] = zopfli_enabled::enabled & 1;
    std::__cxx11::string::~string((string *)local_30);
  }
  else {
    value.field_2._M_local_buf[0xf] = '\0';
  }
  return (bool)(value.field_2._M_local_buf[0xf] & 1);
}

Assistant:

bool
Pl_Flate::zopfli_enabled()
{
    if (zopfli_supported()) {
        std::string value;
        static bool enabled = QUtil::get_env("QPDF_ZOPFLI", &value) && value != "disabled";
        return enabled;
    } else {
        return false;
    }
}